

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_search_tree_kernel_2.h
# Opt level: O3

void __thiscall
dlib::
binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::fix_after_remove(binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *this,node *t)

{
  node **ppnVar1;
  node *temp_1;
  node *pnVar2;
  node *pnVar3;
  node *pnVar4;
  node **ppnVar5;
  node *temp;
  node *pnVar6;
  node **ppnVar7;
  
  pnVar4 = this->tree_root;
  if (pnVar4 != t) {
    ppnVar1 = &this->tree_root;
    do {
      if (t->color != '\x01') break;
      ppnVar5 = &t->parent;
      pnVar2 = t->parent;
      pnVar3 = pnVar2->left;
      if (pnVar3 == t) {
        pnVar3 = pnVar2->right;
        if (pnVar3->color == '\0') {
          pnVar3->color = '\x01';
          pnVar2->color = '\0';
          pnVar6 = pnVar3->left;
          pnVar2->right = pnVar6;
          if (pnVar6 != this->NIL) {
            pnVar6->parent = pnVar2;
          }
          pnVar3->left = pnVar2;
          pnVar6 = pnVar2->parent;
          pnVar3->parent = pnVar6;
          ppnVar7 = ppnVar1;
          if (pnVar4 != pnVar2) {
            ppnVar7 = &pnVar6->left + (pnVar6->left != pnVar2);
          }
          *ppnVar7 = pnVar3;
          pnVar2->parent = pnVar3;
          pnVar2 = *ppnVar5;
          pnVar3 = pnVar2->right;
        }
        pnVar4 = pnVar3->left;
        pnVar6 = pnVar3->right;
        if (pnVar4->color == '\x01') {
          if (pnVar6->color == '\x01') {
            pnVar3->color = '\0';
            goto LAB_0023c59c;
          }
        }
        else if (pnVar6->color == '\x01') {
          pnVar4->color = '\x01';
          pnVar3->color = '\0';
          pnVar2 = pnVar4->right;
          pnVar3->left = pnVar2;
          if (pnVar2 != this->NIL) {
            pnVar2->parent = pnVar3;
          }
          pnVar4->right = pnVar3;
          pnVar2 = pnVar3->parent;
          pnVar4->parent = pnVar2;
          ppnVar7 = ppnVar1;
          if (*ppnVar1 != pnVar3) {
            ppnVar7 = &pnVar2->left + (pnVar2->left != pnVar3);
          }
          *ppnVar7 = pnVar4;
          pnVar3->parent = pnVar4;
          pnVar2 = *ppnVar5;
          pnVar3 = pnVar2->right;
          pnVar4 = pnVar3->left;
          pnVar6 = pnVar3->right;
        }
        pnVar3->color = pnVar2->color;
        pnVar2->color = '\x01';
        pnVar6->color = '\x01';
        pnVar2->right = pnVar4;
        if (pnVar4 != this->NIL) {
          pnVar4->parent = pnVar2;
        }
        pnVar3->left = pnVar2;
        pnVar4 = pnVar2->parent;
        pnVar3->parent = pnVar4;
        ppnVar5 = ppnVar1;
        if (*ppnVar1 != pnVar2) {
          ppnVar5 = &pnVar4->left + (pnVar4->left != pnVar2);
        }
        *ppnVar5 = pnVar3;
        pnVar2->parent = pnVar3;
        ppnVar5 = ppnVar1;
      }
      else {
        if (pnVar3->color == '\0') {
          pnVar3->color = '\x01';
          pnVar2->color = '\0';
          pnVar6 = pnVar3->right;
          pnVar2->left = pnVar6;
          if (pnVar6 != this->NIL) {
            pnVar6->parent = pnVar2;
          }
          pnVar3->right = pnVar2;
          pnVar6 = pnVar2->parent;
          pnVar3->parent = pnVar6;
          ppnVar7 = ppnVar1;
          if (pnVar4 != pnVar2) {
            ppnVar7 = &pnVar6->left + (pnVar6->left != pnVar2);
          }
          *ppnVar7 = pnVar3;
          pnVar2->parent = pnVar3;
          pnVar2 = *ppnVar5;
          pnVar3 = pnVar2->left;
        }
        pnVar4 = pnVar3->left;
        if (pnVar4->color == '\x01') {
          pnVar4 = pnVar3->right;
          if (pnVar4->color == '\x01') {
            pnVar3->color = '\0';
            goto LAB_0023c59c;
          }
          pnVar4->color = '\x01';
          pnVar3->color = '\0';
          pnVar2 = pnVar4->left;
          pnVar3->right = pnVar2;
          if (pnVar2 != this->NIL) {
            pnVar2->parent = pnVar3;
          }
          pnVar4->left = pnVar3;
          pnVar2 = pnVar3->parent;
          pnVar4->parent = pnVar2;
          ppnVar7 = ppnVar1;
          if (*ppnVar1 != pnVar3) {
            ppnVar7 = &pnVar2->left + (pnVar2->left != pnVar3);
          }
          *ppnVar7 = pnVar4;
          pnVar3->parent = pnVar4;
          pnVar2 = *ppnVar5;
          pnVar3 = pnVar2->left;
          pnVar4 = pnVar3->left;
        }
        pnVar3->color = pnVar2->color;
        pnVar2->color = '\x01';
        pnVar4->color = '\x01';
        pnVar4 = pnVar3->right;
        pnVar2->left = pnVar4;
        if (pnVar4 != this->NIL) {
          pnVar4->parent = pnVar2;
        }
        pnVar3->right = pnVar2;
        pnVar4 = pnVar2->parent;
        pnVar3->parent = pnVar4;
        ppnVar5 = ppnVar1;
        if (*ppnVar1 != pnVar2) {
          ppnVar5 = &pnVar4->left + (pnVar4->left != pnVar2);
        }
        *ppnVar5 = pnVar3;
        pnVar2->parent = pnVar3;
        ppnVar5 = ppnVar1;
      }
LAB_0023c59c:
      t = *ppnVar5;
      pnVar4 = *ppnVar1;
    } while (t != pnVar4);
  }
  t->color = '\x01';
  return;
}

Assistant:

void binary_search_tree_kernel_2<domain,range,mem_manager,compare>::
    fix_after_remove (
        node* t
    )
    {

        while (t != tree_root && t->color == black)
        {
            if (t->parent->left == t)
            {
                node* sibling = t->parent->right;
                if (sibling->color == red)
                {
                    sibling->color = black;
                    t->parent->color = red;
                    rotate_left(t->parent);
                    sibling = t->parent->right;
                }

                if (sibling->left->color == black && sibling->right->color == black)
                {
                    sibling->color = red;
                    t = t->parent;
                }
                else
                {
                    if (sibling->right->color == black)
                    {
                        sibling->left->color = black;
                        sibling->color = red;
                        rotate_right(sibling);
                        sibling = t->parent->right;
                    }

                    sibling->color = t->parent->color;
                    t->parent->color = black;
                    sibling->right->color = black;
                    rotate_left(t->parent);
                    t = tree_root;

                }


            }
            else
            {

                node* sibling = t->parent->left;
                if (sibling->color == red)
                {
                    sibling->color = black;
                    t->parent->color = red;
                    rotate_right(t->parent);
                    sibling = t->parent->left;
                }

                if (sibling->left->color == black && sibling->right->color == black)
                {
                    sibling->color = red;
                    t = t->parent;
                }
                else
                {
                    if (sibling->left->color == black)
                    {
                        sibling->right->color = black;
                        sibling->color = red;
                        rotate_left(sibling);
                        sibling = t->parent->left;
                    }

                    sibling->color = t->parent->color;
                    t->parent->color = black;
                    sibling->left->color = black;
                    rotate_right(t->parent);
                    t = tree_root;

                }


            }

        }
        t->color = black;
    
    }